

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_data.cpp
# Opt level: O0

void skiwi::destroy_macro_data(macro_data *md)

{
  bool bVar1;
  reference ppVar2;
  pair<void_*,_unsigned_long> *f;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  *__range1;
  macro_data *md_local;
  
  __end1 = std::
           vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
           ::begin(&md->compiled_macros);
  f = (pair<void_*,_unsigned_long> *)
      std::
      vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>::
      end(&md->compiled_macros);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::pair<void_*,_unsigned_long>_*,_std::vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>_>
                                *)&f);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<void_*,_unsigned_long>_*,_std::vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>_>
             ::operator*(&__end1);
    assembler::free_assembled_function(ppVar2->first,ppVar2->second);
    __gnu_cxx::
    __normal_iterator<std::pair<void_*,_unsigned_long>_*,_std::vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ::clear(&md->compiled_macros);
  return;
}

Assistant:

void destroy_macro_data(macro_data& md)
  {
#ifdef _SKIWI_FOR_ARM
    for (auto& f : md.compiled_macros)
      ASM::free_bytecode((void*)f.first, f.second);
    md.compiled_macros.clear();
#else
  for (auto& f : md.compiled_macros)
    ASM::free_assembled_function(f.first, f.second);
  md.compiled_macros.clear();
#endif
  }